

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef
          (EliminateDeadOutputStoresPass *this,Instruction *ref,Instruction *var)

{
  DecorationManager *this_00;
  TypeManager *this_01;
  LivenessManager *this_02;
  bool bVar1;
  Analysis AVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  long lVar7;
  Instruction *this_03;
  iterator iVar8;
  long *plVar9;
  uint uVar10;
  IRContext *pIVar11;
  IRContext *pIVar12;
  uint32_t builtin;
  uint32_t local_8c;
  Instruction *local_88;
  uint32_t local_7c;
  DefUseManager *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pIVar12 = (this->super_Pass).context_;
  AVar2 = pIVar12->valid_analyses_;
  pIVar11 = pIVar12;
  local_88 = ref;
  if ((AVar2 & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar12);
    pIVar11 = (this->super_Pass).context_;
    AVar2 = pIVar11->valid_analyses_;
  }
  this_00 = (pIVar12->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  pIVar12 = pIVar11;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar11);
    pIVar12 = (this->super_Pass).context_;
    AVar2 = pIVar12->valid_analyses_;
  }
  local_78 = (pIVar11->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar11 = pIVar12;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(pIVar12);
    pIVar11 = (this->super_Pass).context_;
    AVar2 = pIVar11->valid_analyses_;
  }
  this_01 = (pIVar12->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 >> 0x11 & 1) == 0) {
    IRContext::BuildLivenessManager(pIVar11);
  }
  this_02 = (pIVar11->liveness_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::LivenessManager_*,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false>._M_head_impl;
  local_8c = 0x7fffffff;
  uVar3 = 0;
  if (var->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = &local_8c;
  local_38 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:125:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:125:7)>
             ::_M_manager;
  analysis::DecorationManager::WhileEachDecoration
            (this_00,uVar3,0xb,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_8c == 0x7fffffff) {
    if (local_88->opcode_ - OpPtrAccessChain < 0xfffffffe) {
      return;
    }
    uVar3 = 0;
    if (var->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(var,0);
    }
    pTVar6 = analysis::TypeManager::GetType(this_01,uVar3);
    iVar4 = (*pTVar6->_vptr_Type[0x21])(pTVar6);
    plVar9 = *(long **)(CONCAT44(extraout_var,iVar4) + 0x28);
    lVar7 = (**(code **)(*plVar9 + 0xc0))(plVar9);
    if (lVar7 == 0) {
      iVar4 = 1;
    }
    else {
      plVar9 = *(long **)(lVar7 + 0x28);
      iVar4 = 2;
    }
    pTVar6 = (Type *)(**(code **)(*plVar9 + 0xf0))(plVar9);
    uVar3 = analysis::TypeManager::GetId(this_01,pTVar6);
    uVar10 = (local_88->has_result_id_ & 1) + 1;
    if (local_88->has_type_id_ == false) {
      uVar10 = (uint)local_88->has_result_id_;
    }
    uVar5 = Instruction::GetSingleWordOperand(local_88,uVar10 + iVar4);
    this_03 = analysis::DefUseManager::GetDef(local_78,uVar5);
    if (this_03->opcode_ != OpConstant) {
      __assert_fail("member_idx_inst->opcode() == spv::Op::OpConstant && \"unexpected non-constant index\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                    ,0x9c,
                    "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                   );
    }
    uVar5 = (this_03->has_result_id_ & 1) + 1;
    if (this_03->has_type_id_ == false) {
      uVar5 = (uint)this_03->has_result_id_;
    }
    local_70._0_4_ = Instruction::GetSingleWordOperand(this_03,uVar5);
    local_70._4_4_ = 0;
    local_70._8_8_ = &local_8c;
    local_58 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:160:7)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:160:7)>
               ::_M_manager;
    analysis::DecorationManager::WhileEachDecoration
              (this_00,uVar3,0xb,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    if (local_8c == 0x7fffffff) {
      __assert_fail("builtin != uint32_t(spv::BuiltIn::Max) && \"builtin not found\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp"
                    ,0xac,
                    "void spvtools::opt::EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(Instruction *, Instruction *)"
                   );
    }
  }
  bVar1 = analysis::LivenessManager::IsAnalyzedBuiltin(this_02,local_8c);
  if (bVar1) {
    local_7c = local_8c;
    iVar8 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&this->live_builtins_->_M_h,&local_7c);
    if (iVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      KillAllStoresOfRef(this,local_88);
    }
  }
  return;
}

Assistant:

void EliminateDeadOutputStoresPass::KillAllDeadStoresOfBuiltinRef(
    Instruction* ref, Instruction* var) {
  auto deco_mgr = context()->get_decoration_mgr();
  auto def_use_mgr = context()->get_def_use_mgr();
  auto type_mgr = context()->get_type_mgr();
  auto live_mgr = context()->get_liveness_mgr();
  // Search for builtin decoration of base variable
  uint32_t builtin = uint32_t(spv::BuiltIn::Max);
  auto var_id = var->result_id();
  (void)deco_mgr->WhileEachDecoration(
      var_id, uint32_t(spv::Decoration::BuiltIn),
      [&builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpDecorate && "unexpected decoration");
        builtin = deco.GetSingleWordInOperand(kOpDecorateBuiltInLiteralInIdx);
        return false;
      });
  // If analyzed builtin and not live, kill stores.
  if (builtin != uint32_t(spv::BuiltIn::Max)) {
    if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
      KillAllStoresOfRef(ref);
    return;
  }
  // Search for builtin decoration on indexed member
  auto ref_op = ref->opcode();
  if (ref_op != spv::Op::OpAccessChain &&
      ref_op != spv::Op::OpInBoundsAccessChain) {
    return;
  }
  uint32_t in_idx = kOpAccessChainIdx0InIdx;
  analysis::Type* var_type = type_mgr->GetType(var->type_id());
  analysis::Pointer* ptr_type = var_type->AsPointer();
  auto curr_type = ptr_type->pointee_type();
  auto arr_type = curr_type->AsArray();
  if (arr_type) {
    curr_type = arr_type->element_type();
    ++in_idx;
  }
  auto str_type = curr_type->AsStruct();
  auto str_type_id = type_mgr->GetId(str_type);
  auto member_idx_id = ref->GetSingleWordInOperand(in_idx);
  auto member_idx_inst = def_use_mgr->GetDef(member_idx_id);
  assert(member_idx_inst->opcode() == spv::Op::OpConstant &&
         "unexpected non-constant index");
  auto ac_idx = member_idx_inst->GetSingleWordInOperand(kOpConstantValueInIdx);
  (void)deco_mgr->WhileEachDecoration(
      str_type_id, uint32_t(spv::Decoration::BuiltIn),
      [ac_idx, &builtin](const Instruction& deco) {
        assert(deco.opcode() == spv::Op::OpMemberDecorate &&
               "unexpected decoration");
        auto deco_idx =
            deco.GetSingleWordInOperand(kOpDecorateMemberMemberInIdx);
        if (deco_idx == ac_idx) {
          builtin =
              deco.GetSingleWordInOperand(kOpDecorateMemberBuiltInLiteralInIdx);
          return false;
        }
        return true;
      });
  assert(builtin != uint32_t(spv::BuiltIn::Max) && "builtin not found");
  // If analyzed builtin and not live, kill stores.
  if (live_mgr->IsAnalyzedBuiltin(builtin) && !IsLiveBuiltin(builtin))
    KillAllStoresOfRef(ref);
}